

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void __thiscall kratos::EnableStmtVisitor::visit(EnableStmtVisitor *this,ScopedStmtBlock *stmt)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  uint64_t uVar2;
  Generator *pGVar3;
  element_type *stmt_00;
  element_type *peVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  element_type *local_70 [3];
  undefined1 local_58 [8];
  shared_ptr<kratos::Var> cond;
  shared_ptr<kratos::Stmt> *s;
  uint i;
  Generator *gen;
  uint64_t count;
  ScopedStmtBlock *stmt_local;
  EnableStmtVisitor *this_local;
  
  uVar2 = StmtBlock::size(&stmt->super_StmtBlock);
  pGVar3 = Stmt::generator_parent((Stmt *)stmt);
  for (s._4_4_ = 0; s._4_4_ < uVar2; s._4_4_ = s._4_4_ + 1) {
    this_00 = &cond.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    StmtBlock::get_stmt((StmtBlock *)this_00,(uint64_t)stmt);
    stmt_00 = std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::get
                        ((__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)this_00);
    get_cond((EnableStmtVisitor *)local_58,stmt_00);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_58);
    if (bVar1) {
      local_70[0] = std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::get
                              ((__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)this_00);
      peVar4 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_58);
      (*(peVar4->super_IRNode)._vptr_IRNode[0x22])(&local_90,peVar4,pGVar3);
      std::
      unordered_map<kratos::Stmt_const*,std::__cxx11::string,std::hash<kratos::Stmt_const*>,std::equal_to<kratos::Stmt_const*>,std::allocator<std::pair<kratos::Stmt_const*const,std::__cxx11::string>>>
      ::emplace<kratos::Stmt*,std::__cxx11::string>
                ((unordered_map<kratos::Stmt_const*,std::__cxx11::string,std::hash<kratos::Stmt_const*>,std::equal_to<kratos::Stmt_const*>,std::allocator<std::pair<kratos::Stmt_const*const,std::__cxx11::string>>>
                  *)&this->values,local_70,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
    }
    std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_58);
    std::shared_ptr<kratos::Stmt>::~shared_ptr
              ((shared_ptr<kratos::Stmt> *)
               &cond.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return;
}

Assistant:

void visit(ScopedStmtBlock* stmt) override {
        auto count = stmt->size();
        auto* gen = stmt->generator_parent();
        for (auto i = 0u; i < count; i++) {
            auto const& s = stmt->get_stmt(i);
            auto cond = get_cond(s.get());
            if (cond) {
                values.emplace(s.get(), cond->handle_name(gen));
            }
        }
    }